

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* read_all_lines(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *__return_storage_ptr__,string *path)

{
  char cVar1;
  istream *piVar2;
  string line;
  ifstream ifs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  long local_228 [65];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream((istream *)local_228,(string *)path,_S_in);
  local_248._M_string_length = 0;
  local_248.field_2._M_local_buf[0] = '\0';
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_228[0] + -0x18) + (char)(istream *)local_228
                           );
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_228,(string *)&local_248,cVar1);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_248);
  }
  std::ifstream::close();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
  std::ifstream::~ifstream(local_228);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string>
read_all_lines(const std::string &path)
{
    std::vector<std::string> result;
    std::ifstream ifs{path, std::ifstream::in};
    std::string line;
    while (getline(ifs, line))
        result.push_back(std::move(line));
    ifs.close();
    return result;
}